

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

void __thiscall
HighsCliqueTable::addImplications
          (HighsCliqueTable *this,HighsDomain *domain,HighsInt col,HighsInt val)

{
  Reason reason;
  Reason reason_00;
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_> *this_00;
  char *pcVar5;
  anon_class_40_5_13abfe59 *f;
  HighsInt in_ECX;
  HighsInt in_EDX;
  int __c;
  int __c_00;
  HighsDomain *in_RSI;
  long in_RDI;
  bool infeas;
  anon_class_40_5_13abfe59 doFixings;
  Substitution subst;
  CliqueVar v;
  anon_class_40_5_13abfe59 *in_stack_ffffffffffffff58;
  HighsDomain *in_stack_ffffffffffffff68;
  HighsInt in_stack_ffffffffffffff70;
  HighsBoundType in_stack_ffffffffffffff74;
  HighsDomain *in_stack_ffffffffffffff78;
  HighsInt in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  char local_60 [8];
  CliqueVar *local_58;
  HighsDomain *local_50;
  HighsInt *local_48;
  HighsInt *local_40;
  Reason local_38;
  Reason local_30;
  CliqueVar local_28;
  value_type local_24;
  CliqueVar local_1c;
  HighsInt local_18;
  HighsInt local_14;
  HighsDomain *local_10;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  CliqueVar::CliqueVar(&local_1c,in_EDX,in_ECX);
  do {
    do {
      while( true ) {
        pcVar5 = (char *)(ulong)((uint)local_1c & 0x7fffffff);
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x100),(size_type)pcVar5)
        ;
        if (*pvVar2 == 0) {
          local_58 = &local_1c;
          local_50 = local_10;
          local_48 = &local_14;
          local_40 = &local_18;
          this_00 = (vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_> *)
                    (in_RDI + 0x18);
          pcVar5 = CliqueVar::index(&local_1c,pcVar5,__c);
          std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::
          operator[](this_00,(long)(int)pcVar5);
          pcVar5 = local_60;
          bVar1 = HighsHashTree<int,int>::
                  for_each<HighsCliqueTable::addImplications(HighsDomain&,int,int)::__0&>
                            ((HighsHashTree<int,_int> *)this_00,in_stack_ffffffffffffff58);
          if (bVar1) {
            return;
          }
          f = (anon_class_40_5_13abfe59 *)(in_RDI + 0x30);
          pcVar5 = CliqueVar::index(&local_1c,pcVar5,__c_00);
          std::vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>::
          operator[]((vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_> *
                     )f,(long)(int)pcVar5);
          HighsHashTree<int,void>::
          for_each<HighsCliqueTable::addImplications(HighsDomain&,int,int)::__0&>
                    ((HighsHashTree<int,_void> *)this_00,f);
          return;
        }
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x100),
                            (ulong)((uint)local_1c & 0x7fffffff));
        pvVar3 = std::
                 vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                 ::operator[]((vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                               *)(in_RDI + 0x118),(long)(*pvVar2 + -1));
        local_24 = *pvVar3;
        if ((int)local_1c < 0) {
          local_28 = local_24.replace;
        }
        else {
          local_28 = CliqueVar::complement((CliqueVar *)in_stack_ffffffffffffff58);
        }
        local_1c = local_28;
        if (-1 < (int)local_28) break;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_10->col_lower_,(ulong)((uint)local_28 & 0x7fffffff));
        if ((*pvVar4 != 1.0) || (NAN(*pvVar4))) {
          in_stack_ffffffffffffff84 = (uint)local_1c & 0x7fffffff;
          in_stack_ffffffffffffff78 = local_10;
          local_30 = HighsDomain::Reason::cliqueTable(local_14,local_18);
          reason.index = in_stack_ffffffffffffff84;
          reason.type = in_stack_ffffffffffffff80;
          HighsDomain::changeBound
                    (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                     (double)in_stack_ffffffffffffff68,reason);
          bVar1 = HighsDomain::infeasible(local_10);
          if (bVar1) {
            return;
          }
        }
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_10->col_upper_,(ulong)((uint)local_28 & 0x7fffffff));
    } while ((*pvVar4 == 0.0) && (!NAN(*pvVar4)));
    in_stack_ffffffffffffff74 = (uint)local_1c & 0x7fffffff;
    in_stack_ffffffffffffff68 = local_10;
    local_38 = HighsDomain::Reason::cliqueTable(local_14,local_18);
    reason_00.index = in_stack_ffffffffffffff84;
    reason_00.type = in_stack_ffffffffffffff80;
    HighsDomain::changeBound
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
               (double)in_stack_ffffffffffffff68,reason_00);
    bVar1 = HighsDomain::infeasible(local_10);
  } while (!bVar1);
  return;
}

Assistant:

void HighsCliqueTable::addImplications(HighsDomain& domain, HighsInt col,
                                       HighsInt val) {
  CliqueVar v(col, val);

  while (colsubstituted[v.col]) {
    assert((HighsInt)substitutions.size() > colsubstituted[v.col] - 1);
    Substitution subst = substitutions[colsubstituted[v.col] - 1];
    v = v.val == 1 ? subst.replace : subst.replace.complement();
    if (v.val == 1) {
      if (domain.col_lower_[v.col] == 1.0) continue;

      domain.changeBound(HighsBoundType::kLower, v.col, 1.0,
                         HighsDomain::Reason::cliqueTable(col, val));
      if (domain.infeasible()) return;
    } else {
      if (domain.col_upper_[v.col] == 0.0) continue;

      domain.changeBound(HighsBoundType::kUpper, v.col, 0.0,
                         HighsDomain::Reason::cliqueTable(col, val));
      if (domain.infeasible()) return;
    }
  }

  auto doFixings = [&](HighsInt cliqueid) {
    HighsInt start = cliques[cliqueid].start;
    HighsInt end = cliques[cliqueid].end;

    for (HighsInt i = start; i != end; ++i) {
      if (cliqueentries[i].col == v.col) continue;

      if (cliqueentries[i].val == 1) {
        if (domain.col_upper_[cliqueentries[i].col] == 0.0) continue;

        domain.changeBound(HighsBoundType::kUpper, cliqueentries[i].col, 0.0,
                           HighsDomain::Reason::cliqueTable(col, val));
        if (domain.infeasible()) return true;
      } else {
        if (domain.col_lower_[cliqueentries[i].col] == 1.0) continue;

        domain.changeBound(HighsBoundType::kLower, cliqueentries[i].col, 1.0,
                           HighsDomain::Reason::cliqueTable(col, val));
        if (domain.infeasible()) return true;
      }
    }

    return false;
  };

  bool infeas = invertedHashList[v.index()].for_each(doFixings);

  if (infeas) return;

  invertedHashListSizeTwo[v.index()].for_each(doFixings);
}